

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O2

void __thiscall
Hospital::Read_From_File_And_Create_Timetable
          (Hospital *this,
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *Timetable,fstream *inFile)

{
  long lVar1;
  ostream *poVar2;
  int iVar3;
  int local_b4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  temp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string item;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar1 = *(long *)(*(long *)inFile + -0x18);
  if (((byte)inFile[lVar1 + 0x20] & 5) == 0) {
    temp.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    temp.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    temp.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    item._M_dataplus._M_p = (pointer)&item.field_2;
    item._M_string_length = 0;
    item.field_2._M_local_buf[0] = '\0';
    iVar3 = 0;
    local_b4 = 0;
    while ((((byte)inFile[lVar1 + 0x20] & 2) == 0 && (local_b4 != 7))) {
      std::operator>>((istream *)inFile,(string *)&item);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&temp,&item);
      if (iVar3 == 6) {
        std::operator+(&local_90,"    ",
                       temp.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
        std::operator+(&local_50,&local_90,"    ");
        lVar1 = (long)local_b4;
        std::__cxx11::string::operator=
                  (*(string **)
                    &(Timetable->
                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[lVar1].
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_90);
        std::operator+(&local_90,"    ",
                       temp.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
        std::operator+(&local_50,&local_90,"    ");
        std::__cxx11::string::operator=
                  ((string *)
                   (*(long *)&(Timetable->
                              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[lVar1].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data + 0x20),(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_90);
        std::operator+(&local_90,"    ",
                       temp.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 2);
        std::operator+(&local_50,&local_90,"    ");
        std::__cxx11::string::operator=
                  ((string *)
                   (*(long *)&(Timetable->
                              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[lVar1].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data + 0x40),(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_90);
        std::operator+(&local_90,"    ",
                       temp.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 3);
        std::operator+(&local_50,&local_90,"    ");
        std::__cxx11::string::operator=
                  ((string *)
                   (*(long *)&(Timetable->
                              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[lVar1].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data + 0x60),(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_90);
        std::operator+(&local_90,"    ",
                       temp.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 4);
        std::operator+(&local_50,&local_90,"    ");
        std::__cxx11::string::operator=
                  ((string *)
                   (*(long *)&(Timetable->
                              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[lVar1].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data + 0x80),(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_90);
        std::operator+(&local_90,"    ",
                       temp.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 5);
        std::operator+(&local_50,&local_90,"    ");
        std::__cxx11::string::operator=
                  ((string *)
                   (*(long *)&(Timetable->
                              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[lVar1].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data + 0xa0),(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_90);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&temp);
        local_b4 = local_b4 + 1;
        iVar3 = 0;
      }
      iVar3 = iVar3 + 1;
      lVar1 = *(long *)(*(long *)inFile + -0x18);
    }
    std::__cxx11::string::~string((string *)&item);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&temp);
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Error opening file 3!!! ");
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(1);
}

Assistant:

void Hospital::Read_From_File_And_Create_Timetable (vector<vector<string>>& Timetable , fstream& inFile) {

    if (inFile.fail()){
        cerr << "Error opening file 3!!! " <<endl;
        exit(1) ;
    }

    vector<string>temp;
    string item;
    int counter=0 , index = 0;

    while(!inFile.eof() && index != 7 ) {
        inFile >> item ;
        temp.push_back(item);

        if(counter==6){
            Timetable[index][0] ="    "+ temp[0]+ "    ";
            Timetable[index][1] ="    "+ temp[1]+ "    ";
            Timetable[index][2] ="    "+ temp[2]+ "    ";
            Timetable[index][3] ="    "+ temp[3]+ "    ";
            Timetable[index][4] ="    "+ temp[4]+ "    ";
            Timetable[index][5] ="    "+ temp[5]+ "    ";

//            Timetable[index][0] =temp[0];
//            Timetable[index][1] =temp[1];
//            Timetable[index][2] =temp[2];
//            Timetable[index][3] =temp[3];
//            Timetable[index][4] =temp[4];
//            Timetable[index][5] =temp[5];

            temp.clear();
            counter = 0;
            index++;
        }
        counter++;
    }

}